

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int luaY_nvarstack(FuncState *fs)

{
  int iVar1;
  FuncState *fs_local;
  
  iVar1 = reglevel(fs,(uint)fs->nactvar);
  return iVar1;
}

Assistant:

int luaY_nvarstack (FuncState *fs) {
  return reglevel(fs, fs->nactvar);
}